

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_andc_i32_aarch64
               (TCGContext_conflict1 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGOp *pTVar1;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  
  if (have_bmi1_aarch64) {
    pTVar1 = tcg_emit_op_aarch64(tcg_ctx,INDEX_op_andc_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
    return;
  }
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_not_i32(tcg_ctx,ret_00,arg2);
  tcg_gen_and_i32(tcg_ctx,ret,arg1,ret_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_andc_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_andc_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_andc_i32, ret, arg1, arg2);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_not_i32(tcg_ctx, t0,arg2);
        tcg_gen_and_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}